

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestXmlTestReporter.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3cd03::XmlTestReporterFixtureOutputIsCachedUntilReportSummaryIsCalledHelper::
XmlTestReporterFixtureOutputIsCachedUntilReportSummaryIsCalledHelper
          (XmlTestReporterFixtureOutputIsCachedUntilReportSummaryIsCalledHelper *this,
          TestDetails *details)

{
  TestDetails *details_local;
  XmlTestReporterFixtureOutputIsCachedUntilReportSummaryIsCalledHelper *this_local;
  
  XmlTestReporterFixture::XmlTestReporterFixture(&this->super_XmlTestReporterFixture);
  this->m_details = details;
  return;
}

Assistant:

TEST_FIXTURE(XmlTestReporterFixture, OutputIsCachedUntilReportSummaryIsCalled)
{
    TestDetails const details("", "", "", 0);

    reporter.ReportTestStart(details);
    reporter.ReportFailure(details, "message");
    reporter.ReportTestFinish(details, 1.0F);
    CHECK(output.str().empty());

    reporter.ReportSummary(1, 1, 1, 1.0f);
    CHECK(!output.str().empty());
}